

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

string * __thiscall
XPMP2::Aircraft::SoundGetName_abi_cxx11_
          (string *__return_storage_ptr__,Aircraft *this,SoundEventsTy sndEvent,float *volAdj)

{
  uint uVar1;
  CSLModel *pCVar2;
  Doc8643 *pDVar3;
  bool bVar4;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  float fVar8;
  long *local_48 [2];
  long local_38 [2];
  
  pCVar2 = this->pCSLMdl;
  bVar5 = pCVar2->doc8643->classification[1] - 0x30;
  if (9 < bVar5) {
    bVar5 = 0;
  }
  fVar8 = (float)(int)(char)bVar5;
  *volAdj = fVar8;
  switch((ulong)sndEvent) {
  case 0:
    if (pCVar2 == (CSLModel *)0x0) {
      if (glob < 3) {
        uVar1 = this->modeS_id;
        (*this->_vptr_Aircraft[2])(local_48,this);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
               ,0x30c,"SoundGetName",logWARN,
               "Aircraft %08X (%s): No CSL model info, using default engine sound",(ulong)uVar1,
               local_48[0]);
LAB_0023dfdf:
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
    }
    else {
      bVar4 = IsGroundVehicle(this);
      if (bVar4) {
LAB_0023de5e:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "Electric";
        pcVar6 = "";
        break;
      }
      pDVar3 = this->pCSLMdl->doc8643;
      if ((byte)(pDVar3->classification[0] + 0xb9U) < 2) {
        *volAdj = *volAdj + 1.0;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "PropHeli";
        pcVar6 = "";
        break;
      }
      bVar5 = pDVar3->classification[2];
      if (bVar5 < 0x50) {
        if (bVar5 == 0x45) goto LAB_0023de5e;
        if (bVar5 == 0x4a) {
          bVar4 = pDVar3->classification[1] == '1';
          pcVar7 = "LoBypassJet";
          if (bVar4) {
            pcVar7 = "HiBypassJet";
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar6 = "";
          if (bVar4) {
            pcVar6 = "";
          }
          break;
        }
      }
      else {
        if (bVar5 == 0x50) goto LAB_0023dffa;
        if (bVar5 == 0x54) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar7 = "Turboprop";
          pcVar6 = "";
          break;
        }
      }
      if (glob < 3) {
        uVar1 = this->modeS_id;
        (*this->_vptr_Aircraft[2])(local_48,this);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
               ,0x31e,"SoundGetName",logWARN,
               "Aircraft %08X (%s): Unknown engine type \'%c\', using default engine sound",
               (ulong)uVar1,local_48[0],(ulong)(uint)(int)this->pCSLMdl->doc8643->classification[2])
        ;
        goto LAB_0023dfdf;
      }
    }
LAB_0023dffa:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "PropAirplane";
    pcVar6 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "ReverseThrust";
    pcVar6 = "";
    break;
  case 2:
    *volAdj = fVar8 * 0.5;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "RollRunway";
    pcVar6 = "";
    break;
  case 3:
    *volAdj = fVar8 * 0.25;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Gear";
    pcVar6 = "";
    break;
  case 4:
    *volAdj = fVar8 * 0.25;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Flap";
    pcVar6 = "";
    break;
  default:
    if (glob < 4) {
      uVar1 = this->modeS_id;
      (*this->_vptr_Aircraft[2])(local_48,this);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x32a,"SoundGetName",logERR,
             "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",(ulong)uVar1,
             local_48[0],(ulong)sndEvent);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "";
    pcVar7 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string Aircraft::SoundGetName (SoundEventsTy sndEvent, float& volAdj) const
{
    // The default is: The more engines, the louder;
    // that not ownly goes for engine sounds, but also the rest will be bigger the bigger the plane
    volAdj = float(pCSLMdl->GetNumEngines());
    // Now go by event type:
    switch (sndEvent) {
        // Engine Sound is based on aircraft classification
        case SND_ENG:
            // Sanity check: need a CSL model to derive details
            if (!pCSLMdl) {
                LOG_MSG(logWARN, "Aircraft %08X (%s): No CSL model info, using default engine sound",
                        modeS_id, GetFlightId().c_str());
                return XP_SOUND_PROP_AIRPLANE;
            }
            // Now check out engine type and return proper sound name
            if (IsGroundVehicle()) {                                // We assume all ground vehicles are electric cars by now...they should be at least ;-)
                return XP_SOUND_ELECTRIC;
            }
            if (pCSLMdl->HasRotor()) {
                volAdj += 1.0f;                                     // Helis are loud anyway, but louder with more engines
                return XP_SOUND_PROP_HELI;
            }
            switch (pCSLMdl->GetClassEngType()) {
                case 'E': return XP_SOUND_ELECTRIC;
                case 'J': return pCSLMdl->GetClassNumEng() == '1' ? XP_SOUND_HIBYPASSJET : XP_SOUND_LOBYPASSJET;
                case 'P': return XP_SOUND_PROP_AIRPLANE;
                case 'T': return XP_SOUND_TURBOPROP;
                default:
                    LOG_MSG(logWARN, "Aircraft %08X (%s): Unknown engine type '%c', using default engine sound",
                            modeS_id, GetFlightId().c_str(), pCSLMdl->GetClassEngType());
                    return XP_SOUND_PROP_AIRPLANE;
            }
            
        // All other sound types have constant sounds assigned
        case SND_REVERSE_THRUST:                        return XP_SOUND_REVERSE_THRUST;
        case SND_TIRE:              volAdj *= 0.50f;    return XP_SOUND_ROLL_RUNWAY;
        case SND_GEAR:              volAdj *= 0.25f;    return XP_SOUND_GEAR;   // that sound is too loud compared to engines, make it more quiet
        case SND_FLAPS:             volAdj *= 0.25f;    return XP_SOUND_FLAP;   // that sound is too loud compared to engines, make it more quiet
            
        default:
            LOG_MSG(logERR, "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",
                    modeS_id, GetFlightId().c_str(), int(sndEvent));
            return "";
    }
}